

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_0::IsValidResult<float>(float val)

{
  uint uVar1;
  int classified;
  float val_local;
  
  uVar1 = std::fpclassify(val);
  if ((uVar1 < 2) || (uVar1 == 3)) {
    classified._3_1_ = false;
  }
  else {
    classified._3_1_ = true;
  }
  return classified._3_1_;
}

Assistant:

bool IsValidResult(T val) {
  int classified = std::fpclassify(val);
  switch (classified) {
    case FP_NAN:
    case FP_INFINITE:
    case FP_SUBNORMAL:
      return false;
    default:
      return true;
  }
}